

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode Curl_connect(Curl_easy *data,connectdata **in_connect,_Bool *asyncp,_Bool *protocol_done)

{
  byte bVar1;
  curl_proxytype cVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  CURLcode CVar6;
  CURLcode CVar7;
  Curl_easy *pCVar8;
  size_t sVar9;
  connectdata *pcVar10;
  char *pcVar11;
  size_t sVar12;
  byte *pbVar13;
  size_t sVar14;
  char *pcVar15;
  byte *pbVar16;
  char *pcVar17;
  _Bool *p_Var18;
  undefined4 extraout_var;
  long lVar19;
  connectdata *pcVar20;
  char cVar21;
  undefined4 uVar22;
  Curl_handler *pCVar23;
  char **optionsp_00;
  Curl_handler **ppCVar24;
  _Bool _Var25;
  bool bVar26;
  timeval tVar27;
  _Bool waitpipe;
  _Bool force_reuse;
  char *passwd;
  char *user;
  char *options;
  char slashbuf [4];
  char *newname;
  connectdata *conn_temp;
  char *optionsp;
  char *passwdp;
  char protobuf [16];
  _Bool local_e2;
  _Bool local_e1;
  connectdata **local_e0;
  undefined8 local_d8;
  _Bool *local_d0;
  byte *local_c8;
  _Bool *local_c0;
  byte *local_b8;
  size_t local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  Curl_easy *local_80;
  char *local_78;
  size_t local_70;
  connectdata *local_68;
  char *local_60;
  char *local_58;
  _Bool *local_50;
  _Bool local_48 [24];
  
  *asyncp = false;
  local_68 = (connectdata *)0x0;
  local_a0 = (char *)0x0;
  local_a8 = (char *)0x0;
  local_98 = (char *)0x0;
  local_e1 = false;
  local_e2 = false;
  local_50 = protocol_done;
  pCVar8 = (Curl_easy *)Curl_multi_max_host_connections(data->multi);
  sVar9 = Curl_multi_max_total_connections(data->multi);
  *asyncp = false;
  if ((data->change).url == (char *)0x0) {
    CVar6 = CURLE_URL_MALFORMAT;
    in_connect = in_connect;
    asyncp = asyncp;
    goto LAB_0060a45d;
  }
  local_80 = pCVar8;
  pcVar10 = (connectdata *)(*Curl_ccalloc)(1,0x760);
  if (pcVar10 == (connectdata *)0x0) {
LAB_00609fc9:
    pcVar10 = (connectdata *)0x0;
  }
  else {
    pcVar10->handler = &Curl_handler_dummy;
    pcVar10->connection_id = -1;
    pcVar10->port = -1;
    pcVar10->remote_port = -1;
    pcVar10->sock[0] = -1;
    pcVar10->sock[1] = -1;
    pcVar10->tempsock[0] = -1;
    pcVar10->tempsock[1] = -1;
    Curl_conncontrol(pcVar10,1);
    tVar27 = curlx_tvnow();
    pcVar10->created = tVar27;
    pcVar10->data = data;
    cVar2 = (data->set).proxytype;
    (pcVar10->http_proxy).proxytype = cVar2;
    (pcVar10->socks_proxy).proxytype = CURLPROXY_SOCKS4;
    pcVar11 = (data->set).str[0x15];
    if (pcVar11 == (char *)0x0) {
      _Var25 = false;
    }
    else {
      _Var25 = *pcVar11 != '\0';
    }
    (pcVar10->bits).proxy = _Var25;
    (pcVar10->bits).httpproxy = (_Bool)(cVar2 < (CURLPROXY_HTTPS|CURLPROXY_HTTP_1_0) & _Var25);
    (pcVar10->bits).socksproxy = (_Bool)(cVar2 >= (CURLPROXY_HTTPS|CURLPROXY_HTTP_1_0) & _Var25);
    pcVar11 = (data->set).str[0x16];
    if ((pcVar11 != (char *)0x0) && (*pcVar11 != '\0')) {
      (pcVar10->bits).proxy = true;
      (pcVar10->bits).socksproxy = true;
    }
    (pcVar10->bits).proxy_user_passwd = (data->set).str[0x2c] != (char *)0x0;
    (pcVar10->bits).tunnel_proxy = (data->set).tunnel_thru_httpproxy;
    (pcVar10->bits).user_passwd = (data->set).str[0x29] != (char *)0x0;
    (pcVar10->bits).ftp_use_epsv = (data->set).ftp_use_epsv;
    (pcVar10->bits).ftp_use_eprt = (data->set).ftp_use_eprt;
    (pcVar10->ssl_config).verifystatus = (data->set).ssl.primary.verifystatus;
    (pcVar10->ssl_config).verifypeer = (data->set).ssl.primary.verifypeer;
    (pcVar10->ssl_config).verifyhost = (data->set).ssl.primary.verifyhost;
    (pcVar10->proxy_ssl_config).verifystatus = (data->set).proxy_ssl.primary.verifystatus;
    (pcVar10->proxy_ssl_config).verifypeer = (data->set).proxy_ssl.primary.verifypeer;
    (pcVar10->proxy_ssl_config).verifyhost = (data->set).proxy_ssl.primary.verifyhost;
    pcVar10->ip_version = (data->set).ipver;
    _Var25 = Curl_pipeline_wanted(data->multi,1);
    if ((_Var25) && (pcVar10->master_buffer == (char *)0x0)) {
      pcVar11 = (char *)(*Curl_ccalloc)(0x4000,1);
      pcVar10->master_buffer = pcVar11;
      if (pcVar11 != (char *)0x0) goto LAB_00609f08;
LAB_00609f89:
      Curl_llist_destroy(&pcVar10->send_pipe,(void *)0x0);
      Curl_llist_destroy(&pcVar10->recv_pipe,(void *)0x0);
      (*Curl_cfree)(pcVar10->master_buffer);
      (*Curl_cfree)(pcVar10->localdev);
      (*Curl_cfree)(pcVar10);
      goto LAB_00609fc9;
    }
LAB_00609f08:
    Curl_llist_init(&pcVar10->send_pipe,llist_dtor);
    Curl_llist_init(&pcVar10->recv_pipe,llist_dtor);
    pcVar11 = (data->set).str[8];
    if (pcVar11 != (char *)0x0) {
      pcVar11 = (*Curl_cstrdup)(pcVar11);
      pcVar10->localdev = pcVar11;
      if (pcVar11 == (char *)0x0) goto LAB_00609f89;
    }
    pcVar10->localportrange = (data->set).localportrange;
    pcVar10->localport = (data->set).localport;
    pcVar10->fclosesocket = (data->set).fclosesocket;
    pcVar10->closesocket_client = (data->set).closesocket_client;
  }
  if (pcVar10 == (connectdata *)0x0) {
LAB_0060a458:
    CVar6 = CURLE_OUT_OF_MEMORY;
    goto LAB_0060a45d;
  }
  *in_connect = pcVar10;
  local_c0 = asyncp;
  sVar12 = strlen((data->change).url);
  sVar14 = 0x100;
  if (0x100 < sVar12) {
    sVar14 = sVar12;
  }
  (*Curl_cfree)((data->state).pathbuffer);
  (data->state).pathbuffer = (char *)0x0;
  (data->state).path = (char *)0x0;
  pcVar11 = (char *)(*Curl_cmalloc)(sVar14 + 2);
  (data->state).pathbuffer = pcVar11;
  if (pcVar11 != (char *)0x0) {
    (data->state).path = pcVar11;
    pcVar11 = (char *)(*Curl_cmalloc)(sVar14 + 2);
    (pcVar10->host).rawalloc = pcVar11;
    if (pcVar11 != (char *)0x0) {
      (pcVar10->host).name = pcVar11;
      *pcVar11 = '\0';
      local_e0 = in_connect;
      local_a0 = (*Curl_cstrdup)("");
      local_a8 = (*Curl_cstrdup)("");
      local_d0 = (_Bool *)0x674b0e;
      local_98 = (*Curl_cstrdup)("");
      asyncp = local_c0;
      if (local_98 == (char *)0x0 || (local_a8 == (char *)0x0 || local_a0 == (char *)0x0)) {
        CVar6 = CURLE_OUT_OF_MEMORY;
        in_connect = local_e0;
        goto LAB_0060a45d;
      }
      pbVar13 = (byte *)(data->state).path;
      pbVar16 = (byte *)(data->change).url;
      local_70 = sVar9;
      pcVar11 = strpbrk((char *)pbVar16,"\r\n");
      if (pcVar11 == (char *)0x0) {
        local_c8 = pbVar13;
        if (*pbVar16 == 0x3a) {
          pcVar11 = "Bad URL, colon is first character";
          goto LAB_0060a146;
        }
        if (((((byte)((*pbVar16 & 0xdf) + 0xbf) < 0x1a) && (pbVar16[1] == 0x3a)) &&
            (pcVar11 = (data->set).str[7], pcVar11 != (char *)0x0)) &&
           (iVar5 = Curl_strcasecompare(pcVar11,"file"), iVar5 != 0)) {
          uVar22 = 0;
        }
        else {
          lVar19 = 0;
          do {
            cVar21 = (data->change).url[lVar19];
            uVar22 = 0;
            if ((cVar21 == '\0') || (uVar22 = 0, cVar21 == '/')) goto LAB_0060a4f3;
            if (cVar21 == ':') {
              uVar22 = 1;
              goto LAB_0060a4f3;
            }
            lVar19 = lVar19 + 1;
          } while (lVar19 != 0x10);
          uVar22 = 0;
        }
LAB_0060a4f3:
        in_connect = local_e0;
        cVar21 = (char)uVar22;
        if (cVar21 == '\0') {
LAB_0060a51e:
          pcVar11 = (data->set).str[7];
          if (pcVar11 != (char *)0x0) {
            iVar5 = Curl_strcasecompare(pcVar11,"file");
            if (iVar5 != 0) goto LAB_0060a543;
          }
LAB_0060a5cf:
          *local_c8 = 0;
          local_d0 = local_48;
          iVar5 = __isoc99_sscanf((data->change).url);
          if (iVar5 == 2) {
            pcVar11 = "Bad URL";
LAB_0060a613:
            local_d8 = (byte *)((ulong)local_d8._4_4_ << 0x20);
            Curl_failf(data,pcVar11);
            CVar6 = CURLE_URL_MALFORMAT;
            local_d0 = (_Bool *)0x674b0e;
LAB_0060a636:
            bVar26 = false;
          }
          else if (iVar5 < 3) {
            iVar5 = __isoc99_sscanf((data->change).url,"%[^\n/?#]%[^\n]",(pcVar10->host).name);
            if (iVar5 < 1) {
              pcVar11 = "<url> malformed";
              goto LAB_0060a613;
            }
            local_d0 = (_Bool *)(data->set).str[7];
            CVar6 = CURLE_OUT_OF_MEMORY;
            if (local_d0 == (_Bool *)0x0) {
              iVar5 = curl_strnequal("FTP.",(pcVar10->host).name,4);
              if (iVar5 == 0) {
                iVar5 = curl_strnequal("DICT.",(pcVar10->host).name,5);
                if (iVar5 == 0) {
                  iVar5 = curl_strnequal("LDAP.",(pcVar10->host).name,5);
                  if (iVar5 == 0) {
                    iVar5 = curl_strnequal("IMAP.",(pcVar10->host).name,5);
                    if (iVar5 == 0) {
                      iVar5 = curl_strnequal("SMTP.",(pcVar10->host).name,5);
                      if (iVar5 == 0) {
                        iVar5 = curl_strnequal("POP3.",(pcVar10->host).name,5);
                        pcVar11 = "http";
                        local_d0 = (_Bool *)"pop3";
                        if (iVar5 == 0) {
                          local_d0 = (_Bool *)"http";
                        }
                      }
                      else {
                        pcVar11 = "smtp";
                        local_d0 = (_Bool *)pcVar11;
                      }
                    }
                    else {
                      pcVar11 = "IMAP";
                      local_d0 = (_Bool *)pcVar11;
                    }
                  }
                  else {
                    pcVar11 = "LDAP";
                    local_d0 = (_Bool *)pcVar11;
                  }
                  local_d8 = (byte *)CONCAT44(local_d8._4_4_,
                                              (int)CONCAT71((int7)((ulong)pcVar11 >> 8),1));
                  bVar26 = true;
                  in_connect = local_e0;
                  asyncp = local_c0;
                  goto LAB_0060a8bb;
                }
                local_d0 = (_Bool *)0x691e36;
              }
              else {
                local_d0 = (_Bool *)0x6358b9;
              }
            }
            local_d8 = (byte *)CONCAT44(local_d8._4_4_,(int)CONCAT71((int7)((ulong)local_d0 >> 8),1)
                                       );
            bVar26 = true;
          }
          else {
            sVar14 = strlen((char *)&local_90);
            CVar6 = CURLE_OUT_OF_MEMORY;
            bVar26 = true;
            if (sVar14 != 2) {
              pcVar11 = "";
              if (1 < sVar14) {
                pcVar11 = "es";
              }
              Curl_infof(data,"Unwillingly accepted illegal URL using %d slash%s!\n",sVar14,pcVar11)
              ;
              if ((data->change).url_alloc == true) {
                (*Curl_cfree)((data->change).url);
              }
              local_d0 = local_48;
              pcVar11 = curl_maprintf("%s://%s%s",local_d0,(pcVar10->host).name);
              (data->change).url = pcVar11;
              if (pcVar11 == (char *)0x0) {
                local_d8 = (byte *)((ulong)local_d8._4_4_ << 0x20);
                goto LAB_0060a636;
              }
              (data->change).url_alloc = true;
            }
            local_d8 = (byte *)((ulong)local_d8._4_4_ << 0x20);
          }
LAB_0060a8bb:
          CVar7 = CVar6;
          if (bVar26) {
LAB_0060a8c4:
            pcVar11 = (pcVar10->host).name;
            pcVar15 = strchr(pcVar11,0x40);
            pcVar17 = pcVar15 + 1;
            if (pcVar15 == (char *)0x0) {
              pcVar17 = pcVar11;
            }
            pbVar13 = (byte *)strchr(pcVar17,0x3f);
            if (pbVar13 == (byte *)0x0) {
              pbVar13 = local_c8;
              if (*local_c8 == 0) {
                local_c8[0] = 0x2f;
                local_c8[1] = 0;
                goto LAB_0060a94b;
              }
              bVar26 = false;
            }
            else {
              local_b8 = pbVar13;
              local_b0 = strlen((char *)pbVar13);
              pbVar13 = local_c8;
              sVar14 = strlen((char *)local_c8);
              memmove(pbVar13 + local_b0 + 1,pbVar13,sVar14 + 1);
              memcpy(pbVar13 + 1,local_b8,local_b0);
              *pbVar13 = 0x2f;
              *local_b8 = 0;
LAB_0060a94b:
              bVar26 = true;
            }
            if (*pbVar13 == 0x2f) {
              if ((data->set).path_as_is == false) {
                pbVar16 = (byte *)Curl_dedotdotify((char *)pbVar13);
                if (pbVar16 == (byte *)0x0) {
                  CVar7 = CURLE_OUT_OF_MEMORY;
                  pbVar13 = local_c8;
                }
                else {
                  local_b8 = pbVar16;
                  iVar5 = strcmp((char *)pbVar16,(char *)local_c8);
                  if (iVar5 == 0) {
                    (*Curl_cfree)(local_b8);
                    pbVar16 = local_b8;
                    pbVar13 = local_c8;
                  }
                  else {
                    (*Curl_cfree)((data->state).pathbuffer);
                    (data->state).pathbuffer = (char *)local_b8;
                    (data->state).path = (char *)local_b8;
                    bVar26 = true;
                    pbVar16 = local_b8;
                    pbVar13 = local_b8;
                  }
                }
                CVar6 = CVar7;
                if (pbVar16 == (byte *)0x0) goto LAB_0060a162;
              }
            }
            else {
              sVar14 = strlen((char *)pbVar13);
              memmove(pbVar13 + 1,local_c8,sVar14 + 1);
              *local_c8 = 0x2f;
              bVar26 = true;
              pbVar13 = local_c8;
            }
            local_c8 = pbVar13;
            if (bVar26) {
              local_b8 = (byte *)strlen((char *)pbVar13);
              sVar14 = strlen((pcVar10->host).name);
              p_Var18 = local_d0;
              if ((char)local_d8 == '\0') {
                local_b0 = sVar14;
                local_78 = (char *)strlen(local_d0);
                iVar5 = curl_strnequal(p_Var18,(data->change).url,(size_t)local_78);
                if (iVar5 == 0) {
                  Curl_failf(data,"<url> malformed");
                  bVar26 = false;
                  CVar7 = CURLE_URL_MALFORMAT;
                  sVar14 = local_b0;
                }
                else {
                  sVar14 = local_b0 + (long)local_78;
                  iVar5 = curl_strnequal("://",(data->change).url + (long)local_78,3);
                  if (iVar5 == 0) {
                    iVar5 = curl_strnequal("file:",(data->change).url,5);
                    if (iVar5 == 0) {
                      Curl_failf(data,"<url> malformed");
                      bVar26 = false;
                      CVar7 = CURLE_URL_MALFORMAT;
                    }
                    else {
                      bVar26 = true;
                      sVar14 = sVar14 + (ulong)((data->change).url[5] == '/') + 1;
                    }
                  }
                  else {
                    sVar14 = sVar14 + 3;
                    bVar26 = true;
                  }
                }
                if (bVar26) goto LAB_0060ab25;
LAB_0060abe9:
                bVar26 = false;
              }
              else {
LAB_0060ab25:
                pbVar13 = local_b8;
                local_b0 = sVar14;
                pcVar11 = (char *)(*Curl_cmalloc)((size_t)(local_b8 + sVar14 + 1));
                if (pcVar11 == (char *)0x0) {
                  CVar7 = CURLE_OUT_OF_MEMORY;
                  goto LAB_0060abe9;
                }
                local_b8 = pbVar13 + 1;
                memcpy(pcVar11,(data->change).url,local_b0);
                local_78 = pcVar11;
                memcpy(pcVar11 + local_b0,local_c8,(size_t)local_b8);
                if ((data->change).url_alloc == true) {
                  (*Curl_cfree)((data->change).url);
                  (data->change).url = (char *)0x0;
                  (data->change).url_alloc = false;
                }
                pcVar11 = local_78;
                Curl_infof(data,"Rebuilt URL to: %s\n",local_78);
                (data->change).url = pcVar11;
                (data->change).url_alloc = true;
                bVar26 = true;
              }
              CVar6 = CVar7;
              if (!bVar26) goto LAB_0060a162;
            }
            pCVar23 = &Curl_handler_http;
            ppCVar24 = protocols;
            do {
              ppCVar24 = ppCVar24 + 1;
              iVar5 = Curl_strcasecompare(pCVar23->scheme,local_d0);
              if (iVar5 != 0) {
                if ((((uint)(data->set).allowed_protocols & pCVar23->protocol) != 0) &&
                   (((data->state).this_is_a_follow != true ||
                    (((uint)(data->set).redir_protocols & pCVar23->protocol) != 0)))) {
                  pcVar10->given = pCVar23;
                  pcVar10->handler = pCVar23;
                  CVar6 = CURLE_OK;
                  bVar26 = true;
                  goto LAB_0060ac76;
                }
                break;
              }
              pCVar23 = *ppCVar24;
            } while (pCVar23 != (Curl_handler *)0x0);
            bVar26 = false;
            Curl_failf(data,"Protocol \"%s\" not supported or disabled in libcurl",local_d0);
            CVar6 = CURLE_UNSUPPORTED_PROTOCOL;
LAB_0060ac76:
            if (bVar26) {
              CVar6 = CURLE_OK;
              local_90 = (char *)0x0;
              local_58 = (char *)0x0;
              local_60 = (char *)0x0;
              pcVar11 = (pcVar10->host).name;
              pcVar17 = strchr(pcVar11,0x40);
              if (pcVar17 == (char *)0x0) {
LAB_0060ad13:
                (*Curl_cfree)(local_90);
                (*Curl_cfree)(local_58);
                (*Curl_cfree)(local_60);
              }
              else {
                (pcVar10->host).name = pcVar17 + 1;
                if ((data->set).use_netrc == CURL_NETRC_REQUIRED) goto LAB_0060ad13;
                local_d0 = (_Bool *)0x0;
                optionsp_00 = &local_60;
                if ((pcVar10->handler->flags >> 10 & 1) == 0) {
                  optionsp_00 = (char **)0x0;
                }
                CVar6 = parse_login_details(pcVar11,(size_t)(pcVar17 + 1 + ~(ulong)pcVar11),
                                            &local_90,&local_58,optionsp_00);
                if (CVar6 != CURLE_OK) goto LAB_0060ad13;
                if (local_90 == (char *)0x0) {
LAB_0060ae54:
                  CVar6 = (CURLcode)local_d0;
                  if (local_58 != (char *)0x0) {
                    CVar6 = Curl_urldecode(data,local_58,0,&local_88,(size_t *)0x0,false);
                    iVar5 = 10;
                    if (CVar6 == CURLE_OK) {
                      (*Curl_cfree)(local_a8);
                      local_a8 = local_88;
                      iVar5 = 0;
                    }
                    in_connect = local_e0;
                    asyncp = local_c0;
                    if (iVar5 == 10) goto LAB_0060ad13;
                    if (iVar5 != 0) goto LAB_0060ad38;
                  }
                  if (local_60 != (char *)0x0) {
                    CVar6 = Curl_urldecode(data,local_60,0,&local_88,(size_t *)0x0,false);
                    iVar5 = 10;
                    if (CVar6 == CURLE_OK) {
                      (*Curl_cfree)(local_98);
                      local_98 = local_88;
                      iVar5 = 0;
                    }
                    in_connect = local_e0;
                    asyncp = local_c0;
                    if ((iVar5 != 10) && (iVar5 != 0)) goto LAB_0060ad38;
                  }
                  goto LAB_0060ad13;
                }
                (pcVar10->bits).userpwd_in_url = true;
                (pcVar10->bits).user_passwd = true;
                CVar7 = Curl_urldecode(data,local_90,0,&local_88,(size_t *)0x0,false);
                local_d0 = (_Bool *)CONCAT44(extraout_var,CVar7);
                iVar5 = 10;
                if (CVar7 == CURLE_OK) {
                  (*Curl_cfree)(local_a0);
                  local_a0 = local_88;
                  iVar5 = 0;
                }
                if (iVar5 == 10) {
                  CVar6 = (CURLcode)local_d0;
                  goto LAB_0060ad13;
                }
                if (iVar5 == 0) goto LAB_0060ae54;
              }
LAB_0060ad38:
              if (CVar6 == CURLE_OK) {
                pcVar11 = (pcVar10->host).name;
                if ((*pcVar11 == '[') && (pcVar11 = strchr(pcVar11,0x25), pcVar11 != (char *)0x0)) {
                  lVar19 = 3;
                  iVar5 = strncmp("%25",pcVar11,3);
                  if (iVar5 != 0) {
                    Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.\n");
                    lVar19 = 1;
                  }
                  p_Var18 = (_Bool *)strtoul(pcVar11 + lVar19,&local_90,10);
                  pcVar17 = local_90;
                  if (*local_90 == ']') {
                    local_d0 = p_Var18;
                    sVar14 = strlen(local_90);
                    memmove(pcVar11,pcVar17,sVar14 + 1);
                    pcVar10->scope_id = (uint)local_d0;
                  }
                  else {
                    Curl_infof(data,"Invalid IPv6 address format\n");
                  }
                }
                uVar3 = (data->set).scope_id;
                if (uVar3 != 0) {
                  pcVar10->scope_id = uVar3;
                }
                pcVar11 = strchr((char *)local_c8,0x23);
                CVar6 = CURLE_OK;
                if (pcVar11 != (char *)0x0) {
                  *pcVar11 = '\0';
                  pcVar11 = strchr((data->change).url,0x23);
                  if (pcVar11 != (char *)0x0) {
                    *pcVar11 = '\0';
                    CVar6 = CURLE_OK;
                  }
                }
              }
            }
          }
        }
        else {
          iVar5 = Curl_strncasecompare((data->change).url,"file:",5);
          if (iVar5 == 0) {
            if (cVar21 == '\0') goto LAB_0060a51e;
            goto LAB_0060a5cf;
          }
LAB_0060a543:
          pcVar11 = "%[^\n]";
          if (cVar21 != '\0') {
            pcVar11 = "%*15[^\n/:]:%[^\n]";
          }
          iVar5 = __isoc99_sscanf((data->change).url,pcVar11,local_c8);
          if (iVar5 == 1) {
            if (((cVar21 != '\0') && (*local_c8 == 0x2f)) && (local_c8[1] == 0x2f)) {
              pbVar13 = local_c8 + 2;
              sVar14 = strlen((char *)pbVar13);
              memmove(local_c8,pbVar13,sVar14 + 1);
            }
            if ((byte)((*local_c8 & 0xdf) + 0xbf) < 0x1a) {
              bVar26 = local_c8[1] == 0x3a;
            }
            else {
              bVar26 = false;
            }
            if (*local_c8 != 0x2f && !bVar26) {
              iVar5 = curl_strnequal("localhost/",(char *)local_c8,10);
              if ((iVar5 == 0) &&
                 (iVar5 = curl_strnequal("127.0.0.1/",(char *)local_c8,10), iVar5 == 0)) {
                Curl_failf(data,"Invalid file://hostname/, expected localhost or 127.0.0.1 or none")
                ;
                bVar4 = false;
              }
              else {
                pbVar13 = local_c8;
                local_d8 = local_c8 + 9;
                if (local_c8[10] == 0x2f) {
                  local_d8 = local_c8 + 10;
                }
                sVar14 = strlen((char *)local_d8);
                memmove(pbVar13,local_d8,sVar14 + 1);
                bVar4 = true;
                if ((byte)((*pbVar13 & 0xdf) + 0xbf) < 0x1a) {
                  bVar26 = pbVar13[1] == 0x3a;
                }
                else {
                  bVar26 = false;
                }
              }
              if (bVar4) goto LAB_0060a835;
              local_d8 = (byte *)((ulong)local_d8 & 0xffffffff00000000);
              goto LAB_0060a853;
            }
LAB_0060a835:
            if (bVar26) {
              pcVar11 = "File drive letters are only accepted in MSDOS/Windows.";
              goto LAB_0060a841;
            }
            local_d0 = (_Bool *)0x68f413;
            bVar26 = true;
            local_d8 = (byte *)(CONCAT44(local_d8._4_4_,uVar22) ^ 1);
          }
          else {
            pcVar11 = "Bad URL";
LAB_0060a841:
            local_d8 = (byte *)((ulong)local_d8._4_4_ << 0x20);
            Curl_failf(data,pcVar11);
LAB_0060a853:
            bVar26 = false;
          }
          CVar7 = CURLE_URL_MALFORMAT;
          CVar6 = CURLE_URL_MALFORMAT;
          if (bVar26) goto LAB_0060a8c4;
        }
      }
      else {
        pcVar11 = "Illegal characters found in URL";
LAB_0060a146:
        local_d8 = (byte *)((ulong)local_d8 & 0xffffffff00000000);
        Curl_failf(data,pcVar11);
        in_connect = local_e0;
        CVar6 = CURLE_URL_MALFORMAT;
      }
LAB_0060a162:
      if (CVar6 != CURLE_OK) goto LAB_0060a45d;
      if ((char)local_d8 != '\0') {
        pbVar13 = (byte *)curl_maprintf("%s://%s",pcVar10->handler->scheme,(data->change).url);
        if (pbVar13 == (byte *)0x0) {
          CVar6 = CURLE_OUT_OF_MEMORY;
        }
        else {
          bVar1 = *pbVar13;
          pbVar16 = pbVar13;
          while (bVar1 != 0x3a) {
            iVar5 = tolower((uint)bVar1);
            *pbVar16 = (byte)iVar5;
            bVar1 = pbVar16[1];
            pbVar16 = pbVar16 + 1;
          }
          if ((data->change).url_alloc == true) {
            (*Curl_cfree)((data->change).url);
            (data->change).url = (char *)0x0;
            (data->change).url_alloc = false;
          }
          (data->change).url = (char *)pbVar13;
          (data->change).url_alloc = true;
          CVar6 = CURLE_OK;
        }
        if (pbVar13 == (byte *)0x0) goto LAB_0060a45d;
      }
      if (((pcVar10->given->flags & 0x40) != 0) &&
         (pcVar11 = strchr((pcVar10->data->state).path,0x3f), pcVar11 != (char *)0x0)) {
        *pcVar11 = '\0';
      }
      pcVar11 = (data->set).str[0x35];
      if (pcVar11 != (char *)0x0) {
        pcVar11 = (*Curl_cstrdup)(pcVar11);
        pcVar10->oauth_bearer = pcVar11;
        if (pcVar11 == (char *)0x0) goto LAB_0060a458;
      }
      CVar6 = create_conn_helper_init_proxy(pcVar10);
      if (CVar6 == CURLE_OK) {
        if (((pcVar10->given->flags & 1) != 0) && ((pcVar10->bits).httpproxy == true)) {
          (pcVar10->bits).tunnel_proxy = true;
        }
        CVar6 = parse_remote_port(data,pcVar10);
        if ((((CVar6 == CURLE_OK) &&
             (CVar6 = override_login(data,pcVar10,&local_a0,&local_a8,&local_98), CVar6 == CURLE_OK)
             ) && (CVar6 = set_login(pcVar10,local_a0,local_a8,local_98), CVar6 == CURLE_OK)) &&
           (CVar6 = parse_connect_to_slist(data,pcVar10,(data->set).connect_to), CVar6 == CURLE_OK))
        {
          fix_hostname(pcVar10,&pcVar10->host);
          if ((pcVar10->bits).conn_to_host == true) {
            fix_hostname(pcVar10,&pcVar10->conn_to_host);
          }
          if ((pcVar10->bits).httpproxy == true) {
            fix_hostname(pcVar10,&(pcVar10->http_proxy).host);
          }
          if ((pcVar10->bits).socksproxy == true) {
            fix_hostname(pcVar10,&(pcVar10->socks_proxy).host);
          }
          if (((pcVar10->bits).conn_to_host == true) &&
             (iVar5 = Curl_strcasecompare((pcVar10->conn_to_host).name,(pcVar10->host).name),
             iVar5 != 0)) {
            (pcVar10->bits).conn_to_host = false;
          }
          if (((pcVar10->bits).conn_to_port == true) &&
             (pcVar10->conn_to_port == pcVar10->remote_port)) {
            (pcVar10->bits).conn_to_port = false;
          }
          if ((((pcVar10->bits).conn_to_host != false) || ((pcVar10->bits).conn_to_port == true)) &&
             ((pcVar10->bits).httpproxy == true)) {
            (pcVar10->bits).tunnel_proxy = true;
          }
          CVar6 = setup_connection_internals(pcVar10);
          if (CVar6 == CURLE_OK) {
            pcVar10->recv[0] = Curl_recv_plain;
            pcVar10->send[0] = Curl_send_plain;
            pcVar10->recv[1] = Curl_recv_plain;
            pcVar10->send[1] = Curl_send_plain;
            (pcVar10->bits).tcp_fastopen = (data->set).tcp_fastopen;
            if ((pcVar10->handler->flags & 0x10) == 0) {
              pcVar11 = (data->set).str[0x1b];
              (data->set).ssl.primary.CApath = (data->set).str[0x1a];
              (data->set).proxy_ssl.primary.CApath = pcVar11;
              (data->set).ssl.primary.CAfile = (data->set).str[0x1c];
              (data->set).proxy_ssl.primary.CAfile = (data->set).str[0x1d];
              pcVar11 = (data->set).str[0x23];
              (data->set).ssl.primary.random_file = pcVar11;
              (data->set).proxy_ssl.primary.random_file = pcVar11;
              pcVar11 = (data->set).str[0x22];
              (data->set).ssl.primary.egdsocket = pcVar11;
              (data->set).proxy_ssl.primary.egdsocket = pcVar11;
              (data->set).ssl.primary.cipher_list = (data->set).str[0x20];
              (data->set).proxy_ssl.primary.cipher_list = (data->set).str[0x21];
              (data->set).ssl.CRLfile = (data->set).str[0x25];
              (data->set).proxy_ssl.CRLfile = (data->set).str[0x26];
              (data->set).ssl.issuercert = (data->set).str[0x27];
              (data->set).proxy_ssl.issuercert = (data->set).str[0x28];
              pcVar11 = (data->set).str[0];
              pcVar17 = (data->set).str[1];
              (data->set).ssl.cert = pcVar11;
              (data->set).proxy_ssl.cert = pcVar17;
              (data->set).ssl.cert_type = (data->set).str[2];
              (data->set).proxy_ssl.cert_type = (data->set).str[3];
              (data->set).ssl.key = (data->set).str[0xd];
              (data->set).proxy_ssl.key = (data->set).str[0xe];
              (data->set).ssl.key_type = (data->set).str[0x11];
              (data->set).proxy_ssl.key_type = (data->set).str[0x12];
              pcVar15 = (data->set).str[0x10];
              (data->set).ssl.key_passwd = (data->set).str[0xf];
              (data->set).proxy_ssl.key_passwd = pcVar15;
              (data->set).ssl.primary.clientcert = pcVar11;
              (data->set).proxy_ssl.primary.clientcert = pcVar17;
              _Var25 = Curl_clone_primary_ssl_config(&(data->set).ssl.primary,&pcVar10->ssl_config);
              if (_Var25) {
                pcVar11 = (char *)&pcVar10->proxy_ssl_config;
                _Var25 = Curl_clone_primary_ssl_config
                                   (&(data->set).proxy_ssl.primary,(ssl_primary_config *)pcVar11);
                CVar6 = CURLE_OUT_OF_MEMORY;
                in_connect = local_e0;
                asyncp = local_c0;
                if (_Var25) {
                  prune_dead_connections(data);
                  if (((data->set).reuse_fresh == true) && ((data->state).this_is_a_follow != true))
                  {
                    _Var25 = false;
                  }
                  else {
                    pcVar11 = (char *)pcVar10;
                    _Var25 = ConnectionExists(data,pcVar10,&local_68,&local_e1,&local_e2);
                  }
                  pcVar20 = local_68;
                  if (((_Var25 != false) && (local_e1 == false)) &&
                     ((pcVar11 = (char *)local_68, iVar5 = IsPipeliningPossible(data,local_68),
                      iVar5 != 0 && ((pcVar20->recv_pipe).size + (pcVar20->send_pipe).size != 0))))
                  {
                    pcVar11 = "Found connection %ld, with requests in the pipe (%zu)\n";
                    Curl_infof(data,"Found connection %ld, with requests in the pipe (%zu)\n",
                               pcVar20->connection_id);
                    if (((Curl_easy *)pcVar20->bundle->num_connections < local_80) &&
                       (((data->state).conn_cache)->num_connections < local_70)) {
                      pcVar11 = "We can reuse, but we want a new connection anyway\n";
                      _Var25 = false;
                      Curl_infof(data,"We can reuse, but we want a new connection anyway\n");
                    }
                  }
                  pcVar20 = local_68;
                  if (_Var25 == false) {
                    if ((pcVar10->handler->flags & 0x100) != 0) {
                      if ((data->set).ssl_enable_alpn == true) {
                        (pcVar10->bits).tls_enable_alpn = true;
                      }
                      if ((data->set).ssl_enable_npn == true) {
                        (pcVar10->bits).tls_enable_npn = true;
                      }
                    }
                    bVar26 = local_e2 == false;
                    if (bVar26) {
                      pcVar11 = (char *)(data->state).conn_cache;
                      pCVar8 = (Curl_easy *)Curl_conncache_find_bundle(pcVar10,(conncache *)pcVar11)
                      ;
                    }
                    else {
                      pCVar8 = (Curl_easy *)0x0;
                    }
                    if (((local_80 != (Curl_easy *)0x0) && (pCVar8 != (Curl_easy *)0x0)) &&
                       (local_80 <= pCVar8->prev)) {
                      pcVar20 = find_oldest_idle_connection_in_bundle
                                          (pCVar8,(connectbundle *)pcVar11);
                      if (pcVar20 == (connectdata *)0x0) {
                        bVar26 = false;
                        Curl_infof(data,"No more connections allowed to host: %d\n",local_80);
                      }
                      else {
                        pcVar20->data = data;
                        Curl_disconnect(pcVar20,false);
                      }
                    }
                    if (((bool)(local_70 != 0 & bVar26)) &&
                       (local_70 <= ((data->state).conn_cache)->num_connections)) {
                      pcVar20 = Curl_oldest_idle_connection(data);
                      if (pcVar20 == (connectdata *)0x0) {
                        bVar26 = false;
                        Curl_infof(data,"No connections available in cache\n");
                      }
                      else {
                        pcVar20->data = data;
                        Curl_disconnect(pcVar20,false);
                      }
                    }
                    if (bVar26) {
                      Curl_conncache_add_conn((data->state).conn_cache,pcVar10);
                      if ((((data->state).authhost.picked & 0x28) != 0) &&
                         ((data->state).authhost.done == true)) {
                        Curl_infof(data,"NTLM picked AND auth done set, clear picked!\n");
                        (data->state).authhost.picked = 0;
                        (data->state).authhost.done = false;
                      }
                      CVar6 = CURLE_OK;
                      if ((((data->state).authproxy.picked & 0x28) != 0) &&
                         ((data->state).authproxy.done == true)) {
                        CVar6 = CURLE_OK;
                        Curl_infof(data,"NTLM-proxy picked AND auth done set, clear picked!\n");
                        (data->state).authproxy.picked = 0;
                        (data->state).authproxy.done = false;
                      }
                    }
                    else {
                      Curl_infof(data,"No connections available.\n");
                      conn_free(pcVar10);
                      *local_e0 = (connectdata *)0x0;
                      CVar6 = CURLE_NO_CONNECTION_AVAILABLE;
                    }
                    in_connect = local_e0;
                    asyncp = local_c0;
                    if (!bVar26) goto LAB_0060a45d;
                  }
                  else {
                    local_68->inuse = true;
                    reuse_conn(pcVar10,local_68);
                    (*Curl_cfree)(pcVar10);
                    *local_e0 = pcVar20;
                    pcVar11 = "host";
                    if ((pcVar20->bits).proxy != false) {
                      pcVar11 = "proxy";
                    }
                    lVar19 = 0x128;
                    if (((pcVar20->socks_proxy).host.name == (char *)0x0) &&
                       (lVar19 = 0x168, (pcVar20->http_proxy).host.name == (char *)0x0)) {
                      lVar19 = 0xe0;
                    }
                    Curl_infof(data,"Re-using existing connection! (#%ld) with %s %s\n",
                               pcVar20->connection_id,pcVar11,
                               *(undefined8 *)((pcVar20->chunk).hexbuffer + lVar19 + -0x20));
                    pcVar10 = pcVar20;
                  }
                  pcVar10->inuse = true;
                  Curl_init_do(data,pcVar10);
                  CVar6 = setup_range(data);
                  asyncp = local_c0;
                  in_connect = local_e0;
                  if (CVar6 == CURLE_OK) {
                    pcVar10->seek_func = (data->set).seek_func;
                    pcVar10->seek_client = (data->set).seek_client;
                    CVar6 = resolve_server(data,pcVar10,local_c0);
                    in_connect = local_e0;
                  }
                }
              }
              else {
                CVar6 = CURLE_OUT_OF_MEMORY;
                in_connect = local_e0;
                asyncp = local_c0;
              }
            }
            else {
              CVar6 = (*pcVar10->handler->connect_it)(pcVar10,local_48);
              if (CVar6 == CURLE_OK) {
                pcVar10->data = data;
                (pcVar10->bits).tcpconnect[0] = true;
                Curl_conncache_add_conn((data->state).conn_cache,pcVar10);
                CVar6 = setup_range(data);
                if (CVar6 != CURLE_OK) {
                  (*pcVar10->handler->done)(pcVar10,CVar6,false);
                  in_connect = local_e0;
                  asyncp = local_c0;
                  goto LAB_0060a45d;
                }
                CVar6 = CURLE_OK;
                Curl_setup_transfer(pcVar10,-1,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
              }
              Curl_init_do(data,pcVar10);
              in_connect = local_e0;
              asyncp = local_c0;
            }
          }
        }
      }
      goto LAB_0060a45d;
    }
    (*Curl_cfree)((data->state).pathbuffer);
    (data->state).pathbuffer = (char *)0x0;
    (data->state).path = (char *)0x0;
  }
  CVar6 = CURLE_OUT_OF_MEMORY;
  in_connect = in_connect;
  asyncp = local_c0;
LAB_0060a45d:
  (*Curl_cfree)(local_98);
  (*Curl_cfree)(local_a8);
  (*Curl_cfree)(local_a0);
  if (CVar6 == CURLE_OK) {
    pcVar10 = *in_connect;
    if (((pcVar10->send_pipe).size == 0) && ((pcVar10->recv_pipe).size == 0)) {
      CVar6 = CURLE_OK;
      if (*asyncp == false) {
        CVar6 = Curl_setup_conn(pcVar10,local_50);
      }
    }
    else {
      *local_50 = true;
      CVar6 = CURLE_OK;
    }
  }
  if (CVar6 != CURLE_OK) {
    if (CVar6 != CURLE_NO_CONNECTION_AVAILABLE) {
      if (*in_connect == (connectdata *)0x0) {
        return CVar6;
      }
      Curl_disconnect(*in_connect,false);
    }
    *in_connect = (connectdata *)0x0;
  }
  return CVar6;
}

Assistant:

CURLcode Curl_connect(struct Curl_easy *data,
                      struct connectdata **in_connect,
                      bool *asyncp,
                      bool *protocol_done)
{
  CURLcode result;

  *asyncp = FALSE; /* assume synchronous resolves by default */

  /* call the stuff that needs to be called */
  result = create_conn(data, in_connect, asyncp);

  if(!result) {
    /* no error */
    if((*in_connect)->send_pipe.size || (*in_connect)->recv_pipe.size)
      /* pipelining */
      *protocol_done = TRUE;
    else if(!*asyncp) {
      /* DNS resolution is done: that's either because this is a reused
         connection, in which case DNS was unnecessary, or because DNS
         really did finish already (synch resolver/fast async resolve) */
      result = Curl_setup_conn(*in_connect, protocol_done);
    }
  }

  if(result == CURLE_NO_CONNECTION_AVAILABLE) {
    *in_connect = NULL;
    return result;
  }

  if(result && *in_connect) {
    /* We're not allowed to return failure with memory left allocated
       in the connectdata struct, free those here */
    Curl_disconnect(*in_connect, FALSE); /* close the connection */
    *in_connect = NULL;           /* return a NULL */
  }

  return result;
}